

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_cycleselect(_glist *x,t_float foffset)

{
  t_editor *ptVar1;
  _instanceeditor *p_Var2;
  t_selection *ptVar3;
  _gobj *p_Var4;
  t_gobj *y;
  int iVar5;
  t_gobj *ptVar6;
  t_object *ptVar7;
  _outconnect *oc;
  t_object *ptVar8;
  _glist *p_Var9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int snkX2;
  int snkX1;
  int srcX2;
  int srcX1;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  t_linetraverser local_a8;
  
  ptVar1 = x->gl_editor;
  if (ptVar1 == (t_editor *)0x0) {
    return;
  }
  iVar10 = (int)foffset;
  if ((ptVar1->field_0x88 & 7) == 2) {
    iVar5 = ptVar1->e_xwas;
    p_Var2 = (pd_maininstance.pd_gui)->i_editor;
    iVar16 = *(int *)(p_Var2 + 0x80);
    uVar15 = *(uint *)(p_Var2 + 0x84);
    local_a8.tr_x._0_4_ = 0;
    local_c0 = 0;
    local_c4 = 0;
    local_c8 = 0;
    if (*(_glist **)(p_Var2 + 0x78) != x) {
      return;
    }
    ptVar6 = canvas_findhitbox(x,iVar5,ptVar1->e_ywas,(int *)&local_a8,&local_ac,&local_c0,&local_b0
                              );
    if (ptVar6 == (t_gobj *)0x0) {
      ptVar7 = (t_object *)0x0;
    }
    else {
      ptVar7 = pd_checkobject(&ptVar6->g_pd);
    }
    ptVar6 = canvas_findhitbox(x,iVar16,uVar15,&local_c4,&local_b4,&local_c8,&local_b8);
    if (ptVar6 == (t_gobj *)0x0) {
      ptVar8 = (t_object *)0x0;
    }
    else {
      ptVar8 = pd_checkobject(&ptVar6->g_pd);
    }
    iVar14 = local_c0;
    iVar12 = local_c4;
    iVar13 = local_c8;
    if (ptVar7 == (t_object *)0x0) {
      return;
    }
    if ((ptVar8 != (t_object *)0x0) && (ptVar8 != ptVar7)) {
      iVar5 = obj_ninlets(ptVar8);
      if (iVar5 < 2) {
        return;
      }
      iVar13 = iVar13 - iVar12;
      iVar10 = ((iVar13 / 2 + (iVar5 + -1) * (iVar16 - iVar12)) / iVar13 + iVar10) % iVar5 + iVar5;
      p_Var9 = glist_getcanvas((_glist *)((long)iVar10 / (long)iVar5 & 0xffffffff));
      pdgui_vmess("::pdtk_canvas::setmouse","cii",p_Var9,
                  (ulong)(uint)(int)((double)((iVar13 + -7) * (iVar10 % iVar5)) /
                                     ((double)iVar5 + -1.0) + (double)iVar12 + 3.5),(ulong)uVar15);
      return;
    }
    local_bc = (int)local_a8.tr_x;
    iVar13 = obj_noutlets(ptVar7);
    if (iVar13 < 2) {
      return;
    }
    iVar14 = iVar14 - local_bc;
    x->gl_editor->e_xwas =
         (int)((double)((iVar14 + -7) *
                       ((((iVar14 / 2 + (iVar13 + -1) * (iVar5 - local_bc)) / iVar14 + iVar10) %
                         iVar13 + iVar13) % iVar13)) / ((double)iVar13 + -1.0) + (double)local_bc +
              3.5);
    canvas_doconnect(x,iVar16,uVar15,0,0);
    return;
  }
  ptVar3 = ptVar1->e_selection;
  if (ptVar3 != (t_selection *)0x0) {
    uVar15 = 0;
    ptVar6 = x->gl_list;
    for (p_Var4 = ptVar6; p_Var4 != (t_gobj *)0x0; p_Var4 = p_Var4->g_next) {
      uVar15 = uVar15 + 1;
    }
    if (ptVar3->sel_next != (_selection *)0x0) {
      return;
    }
    y = ptVar3->sel_what;
    if (uVar15 == 0 || y == (t_gobj *)0x0) {
      return;
    }
    iVar5 = 0;
    if ((ptVar6 != (t_gobj *)0x0) && (iVar5 = 0, ptVar6 != y)) {
      iVar5 = 0;
      do {
        iVar5 = iVar5 + 1;
        ptVar6 = ptVar6->g_next;
        if (ptVar6 == (_gobj *)0x0) break;
      } while (ptVar6 != y);
    }
    iVar10 = (iVar5 + iVar10) % (int)uVar15;
    glist_deselect(x,y);
    ptVar6 = x->gl_list;
    if ((ptVar6 != (t_gobj *)0x0) && (uVar15 = iVar10 >> 0x1f & uVar15, uVar15 + iVar10 != 0)) {
      iVar10 = uVar15 + iVar10;
      do {
        iVar10 = iVar10 + -1;
        ptVar6 = ptVar6->g_next;
        if (ptVar6 == (_gobj *)0x0) break;
      } while (iVar10 != 0);
    }
    glist_select(x,ptVar6);
    return;
  }
  if ((ptVar1->field_0x88 & 0x20) == 0) {
    return;
  }
  linetraverser_start(&local_a8,x);
  if (iVar10 == 0) {
    return;
  }
  iVar5 = 0;
  iVar16 = 0;
  do {
    oc = linetraverser_next(&local_a8);
    if (oc == (_outconnect *)0x0) {
      if (iVar16 == 0) {
        return;
      }
      uVar11 = (long)((iVar10 + -1) % iVar16 + iVar16) % (long)iVar16 & 0xffffffff;
      linetraverser_start(&local_a8,x);
      goto LAB_001437e7;
    }
    iVar16 = iVar16 + 1;
    if (iVar5 == 0) {
      ptVar7 = (t_object *)x->gl_list;
      iVar13 = 0;
      iVar12 = 0;
      if (ptVar7 != local_a8.tr_ob && ptVar7 != (t_object *)0x0) {
        iVar12 = 0;
        ptVar8 = ptVar7;
        do {
          iVar12 = iVar12 + 1;
          ptVar8 = (t_object *)(ptVar8->te_g).g_next;
          if (ptVar8 == (t_object *)0x0) break;
        } while (ptVar8 != local_a8.tr_ob);
      }
      if (ptVar7 != local_a8.tr_ob2 && ptVar7 != (t_object *)0x0) {
        iVar13 = 0;
        do {
          iVar13 = iVar13 + 1;
          ptVar7 = (t_object *)(ptVar7->te_g).g_next;
          if (ptVar7 == (t_object *)0x0) break;
        } while (ptVar7 != local_a8.tr_ob2);
      }
      ptVar1 = x->gl_editor;
      iVar5 = 0;
      if ((((iVar12 == ptVar1->e_selectline_index1) &&
           (local_a8.tr_outno == ptVar1->e_selectline_outno)) &&
          (iVar13 == ptVar1->e_selectline_index2)) &&
         (iVar5 = 0, local_a8.tr_inno == ptVar1->e_selectline_inno)) {
        iVar5 = iVar16;
      }
    }
    else {
      iVar10 = iVar10 + -1;
    }
  } while (iVar10 != 0);
  goto LAB_001437fe;
  while (iVar10 != 0) {
LAB_001437e7:
    oc = linetraverser_next(&local_a8);
    iVar10 = (int)uVar11;
    uVar11 = (ulong)(iVar10 - 1);
    if (oc == (_outconnect *)0x0) break;
  }
LAB_001437fe:
  if (oc != (_outconnect *)0x0) {
    ptVar7 = (t_object *)x->gl_list;
    iVar5 = 0;
    iVar10 = 0;
    if (ptVar7 != local_a8.tr_ob && ptVar7 != (t_object *)0x0) {
      iVar10 = 0;
      ptVar8 = ptVar7;
      do {
        iVar10 = iVar10 + 1;
        ptVar8 = (t_object *)(ptVar8->te_g).g_next;
        if (ptVar8 == (t_object *)0x0) break;
      } while (ptVar8 != local_a8.tr_ob);
    }
    if (ptVar7 != local_a8.tr_ob2 && ptVar7 != (t_object *)0x0) {
      iVar5 = 0;
      do {
        iVar5 = iVar5 + 1;
        ptVar7 = (t_object *)(ptVar7->te_g).g_next;
        if (ptVar7 == (t_object *)0x0) break;
      } while (ptVar7 != local_a8.tr_ob2);
    }
    glist_selectline(x,oc,iVar10,local_a8.tr_outno,iVar5,local_a8.tr_inno);
  }
  return;
}

Assistant:

static void canvas_cycleselect(t_canvas*x, t_float foffset)
{
        /* select (currentselection+offset)%objectcount */
    int offset = (int)foffset;
    if (!x->gl_editor)
        return;

    if (x->gl_editor->e_onmotion == MA_CONNECT)
    {
            /* during connection, cycle through inlets/outlets */
        int xwas = x->gl_editor->e_xwas,
            ywas = x->gl_editor->e_ywas;
        int xpos = EDITOR->canvas_last_glist_x,
            ypos = EDITOR->canvas_last_glist_y;
        t_object *src, *snk;
        t_gobj*gobj;
        int srcX1=0, srcY1=0, srcX2=0, srcY2=0;
        int snkX1=0, snkY1=0, snkX2=0, snkY2=0;
        if(EDITOR->canvas_last_glist != x)
                /* we don't know the current mouse coordinates in this canvas, so return... */
            return;
        gobj = canvas_findhitbox(x, xwas, ywas, &srcX1, &srcY1, &srcX2, &srcY2);
        src = gobj?pd_checkobject(&gobj->g_pd):0;
        gobj = canvas_findhitbox(x, xpos, ypos, &snkX1, &snkY1, &snkX2, &snkY2);
        snk = gobj?pd_checkobject(&gobj->g_pd):0;

        if(!src) /* this should never happen */
            return;

            /* are we hovering over an object?
             * - if so, cycle through inlets
             * - else, cycle through outlets
             */
        if(snk && snk != src) {
                /* cycle inlets */
            int width = snkX2 - snkX1, hotspot, closest;
            int nios = obj_ninlets(snk);
            if (nios <= 1) /* no use cycling */
                return;
            closest = ((xpos-snkX1) * (nios-1) + width/2)/width;
            closest = ((closest + offset) % nios + nios) % nios;
            hotspot = snkX1 + (width - IOWIDTH) * closest / (nios-1.0) + IOWIDTH*0.5;
            pdgui_vmess("::pdtk_canvas::setmouse", "cii",  glist_getcanvas(x), hotspot, ypos);
        } else {
                /* cycle outlets */
            int width = srcX2 - srcX1, hotspot, closest;
            int nios = obj_noutlets(src);
            if (nios <= 1) /* no use cycling */
                return;
            closest = ((xwas-srcX1) * (nios-1) + width/2)/width;
            closest = ((closest + offset) % nios + nios) % nios;
            hotspot = srcX1 + (width - IOWIDTH) * closest / (nios-1.0) + IOWIDTH*0.5;
            x->gl_editor->e_xwas = hotspot;
            canvas_doconnect(x, xpos, ypos, 0, 0);
        }
        return;
    }
    if (x->gl_editor->e_selection)
    {
            /* cycle the selection to the next object */
        int newindex;
        int objectcount = glist_getindex(x, 0);
            /* only cycle selection if the current selection contains exactly 1 item */
        t_gobj* y = x->gl_editor->e_selection->sel_next ? 0 : x->gl_editor->e_selection->sel_what;
        if (!y || !objectcount)
            return;
        newindex = (glist_getindex(x, y) + offset) % objectcount;
        if (newindex < 0) newindex += objectcount;
        glist_deselect(x, y);
        glist_select(x, glist_nth(x, newindex));
        return;
    }
    if (x->gl_editor->e_selectedline)
    {
            /* if (only) a line is selected, cycle to next line */
        int connectioncount = 0;
        int foundit = 0;
        t_linetraverser t;
        t_outconnect *oc = 0;

        linetraverser_start(&t, x);
        while (offset && (oc = linetraverser_next(&t)))
        {
            connectioncount++;
            if(!foundit) {
                int srcno = glist_getindex(x, &t.tr_ob->ob_g);
                int sinkno = glist_getindex(x, &t.tr_ob2->ob_g);
                if((srcno      == x->gl_editor->e_selectline_index1) &&
                    (t.tr_outno == x->gl_editor->e_selectline_outno) &&
                    (sinkno     == x->gl_editor->e_selectline_index2) &&
                    (t.tr_inno  == x->gl_editor->e_selectline_inno)) {
                    foundit = connectioncount;
                }
            } else
                offset--;
        }

        if (!connectioncount)
            offset = 0;

            /* if the offset is non-0, wrap it... */
        if (offset)
        {
            offset = (((offset - 1) % connectioncount) + connectioncount)
                % connectioncount;
            /* ... and start from the beginning */
            linetraverser_start(&t, x);
            while ((oc = linetraverser_next(&t)))
            {
                if(!offset)break;
                offset--;
            }
        }
        if (oc)
            glist_selectline(x, oc,
                glist_getindex(x, &t.tr_ob->ob_g), t.tr_outno,
                glist_getindex(x, &t.tr_ob2->ob_g), t.tr_inno);
        return;
    }
}